

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int closeUnixFile(sqlite3_file *id)

{
  int extraout_EAX;
  
  unixUnmapfile((unixFile *)id);
  if (-1 < *(int *)&id[3].pMethods) {
    robust_close((unixFile *)id,*(int *)&id[3].pMethods,0x6aaf);
    *(undefined4 *)&id[3].pMethods = 0xffffffff;
  }
  sqlite3_free(id[6].pMethods);
  id[0xc].pMethods = (sqlite3_io_methods *)0x0;
  id[0xd].pMethods = (sqlite3_io_methods *)0x0;
  id[10].pMethods = (sqlite3_io_methods *)0x0;
  id[0xb].pMethods = (sqlite3_io_methods *)0x0;
  id[8].pMethods = (sqlite3_io_methods *)0x0;
  id[9].pMethods = (sqlite3_io_methods *)0x0;
  id[6].pMethods = (sqlite3_io_methods *)0x0;
  id[7].pMethods = (sqlite3_io_methods *)0x0;
  id[4].pMethods = (sqlite3_io_methods *)0x0;
  id[5].pMethods = (sqlite3_io_methods *)0x0;
  id[2].pMethods = (sqlite3_io_methods *)0x0;
  id[3].pMethods = (sqlite3_io_methods *)0x0;
  id->pMethods = (sqlite3_io_methods *)0x0;
  id[1].pMethods = (sqlite3_io_methods *)0x0;
  return extraout_EAX;
}

Assistant:

static int closeUnixFile(sqlite3_file *id){
  unixFile *pFile = (unixFile*)id;
#if SQLITE_MAX_MMAP_SIZE>0
  unixUnmapfile(pFile);
#endif
  if( pFile->h>=0 ){
    robust_close(pFile, pFile->h, __LINE__);
    pFile->h = -1;
  }
#if OS_VXWORKS
  if( pFile->pId ){
    if( pFile->ctrlFlags & UNIXFILE_DELETE ){
      osUnlink(pFile->pId->zCanonicalName);
    }
    vxworksReleaseFileId(pFile->pId);
    pFile->pId = 0;
  }
#endif
#ifdef SQLITE_UNLINK_AFTER_CLOSE
  if( pFile->ctrlFlags & UNIXFILE_DELETE ){
    osUnlink(pFile->zPath);
    sqlite3_free(*(char**)&pFile->zPath);
    pFile->zPath = 0;
  }
#endif
  OSTRACE(("CLOSE   %-3d\n", pFile->h));
  OpenCounter(-1);
  sqlite3_free(pFile->pUnused);
  memset(pFile, 0, sizeof(unixFile));
  return SQLITE_OK;
}